

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# latex.hpp
# Opt level: O3

void __thiscall
viennamath::rt_latex_translator<viennamath::rt_expression_interface<double>_>::~rt_latex_translator
          (rt_latex_translator<viennamath::rt_expression_interface<double>_> *this)

{
  pointer pprVar1;
  pointer pprVar2;
  
  pprVar2 = (this->processors_).
            super__Vector_base<viennamath::rt_latex_processor_interface<viennamath::rt_expression_interface<double>_>_*,_std::allocator<viennamath::rt_latex_processor_interface<viennamath::rt_expression_interface<double>_>_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pprVar1 = (this->processors_).
            super__Vector_base<viennamath::rt_latex_processor_interface<viennamath::rt_expression_interface<double>_>_*,_std::allocator<viennamath::rt_latex_processor_interface<viennamath::rt_expression_interface<double>_>_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (pprVar2 != pprVar1) {
    do {
      if (*pprVar2 !=
          (rt_latex_processor_interface<viennamath::rt_expression_interface<double>_> *)0x0) {
        (*(*pprVar2)->_vptr_rt_latex_processor_interface[4])();
        pprVar1 = (this->processors_).
                  super__Vector_base<viennamath::rt_latex_processor_interface<viennamath::rt_expression_interface<double>_>_*,_std::allocator<viennamath::rt_latex_processor_interface<viennamath::rt_expression_interface<double>_>_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
      pprVar2 = pprVar2 + 1;
    } while (pprVar2 != pprVar1);
    pprVar2 = (this->processors_).
              super__Vector_base<viennamath::rt_latex_processor_interface<viennamath::rt_expression_interface<double>_>_*,_std::allocator<viennamath::rt_latex_processor_interface<viennamath::rt_expression_interface<double>_>_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
  }
  if (pprVar2 != (pointer)0x0) {
    operator_delete(pprVar2,(long)(this->processors_).
                                  super__Vector_base<viennamath::rt_latex_processor_interface<viennamath::rt_expression_interface<double>_>_*,_std::allocator<viennamath::rt_latex_processor_interface<viennamath::rt_expression_interface<double>_>_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pprVar2
                   );
    return;
  }
  return;
}

Assistant:

~rt_latex_translator()
      {
        for (typename ProcessorArray::iterator it = processors_.begin();
                                               it != processors_.end();
                                             ++it)
        {
          delete *it;
        }
      }